

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::setR4EncryptionParametersInsecure
          (QPDFWriter *this,char *user_password,char *owner_password,bool allow_accessibility,
          bool allow_extract,bool allow_assemble,bool allow_annotate_and_form,
          bool allow_form_filling,bool allow_modify_other,qpdf_r3_print_e print,
          bool encrypt_metadata,bool use_aes)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  set<int,_std::less<int>,_std::allocator<int>_> clear;
  
  clear._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &clear._M_t._M_impl.super__Rb_tree_header._M_header;
  clear._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  clear._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  clear._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       clear._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  interpretR3EncryptionParameters
            ((QPDFWriter *)(ulong)allow_modify_other,&clear,(char *)(ulong)allow_annotate_and_form,
             (char *)CONCAT71(in_register_00000009,allow_accessibility),allow_accessibility,
             allow_extract,allow_assemble,allow_annotate_and_form,allow_form_filling,
             allow_modify_other,print,qpdf_r3m_all);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->encrypt_use_aes = use_aes;
  peVar1->encrypt_metadata = encrypt_metadata;
  setEncryptionParameters(this,user_password,owner_password,4,4,0x10,&clear);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&clear._M_t);
  return;
}

Assistant:

void
QPDFWriter::setR4EncryptionParametersInsecure(
    char const* user_password,
    char const* owner_password,
    bool allow_accessibility,
    bool allow_extract,
    bool allow_assemble,
    bool allow_annotate_and_form,
    bool allow_form_filling,
    bool allow_modify_other,
    qpdf_r3_print_e print,
    bool encrypt_metadata,
    bool use_aes)
{
    std::set<int> clear;
    interpretR3EncryptionParameters(
        clear,
        user_password,
        owner_password,
        allow_accessibility,
        allow_extract,
        allow_assemble,
        allow_annotate_and_form,
        allow_form_filling,
        allow_modify_other,
        print,
        qpdf_r3m_all);
    m->encrypt_use_aes = use_aes;
    m->encrypt_metadata = encrypt_metadata;
    setEncryptionParameters(user_password, owner_password, 4, 4, 16, clear);
}